

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O1

size_t __thiscall
merlin::graphical_model::induced_width(graphical_model *this,variable_order_t *order)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  ulong uVar3;
  size_t sVar4;
  pointer puVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  size_t n;
  unsigned_long uVar9;
  pointer pvVar10;
  ulong uVar11;
  index i;
  pointer peVar12;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  size_t j;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  my_set<merlin::edge_id> ns;
  graph g;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_190;
  pointer local_178;
  index local_170;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  my_set<merlin::edge_id> local_120;
  graph local_100;
  
  mrf(&local_190,this);
  local_178 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  puVar2 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  n = (long)puVar2 - (long)local_178 >> 3;
  graph::graph(&local_100,n);
  if (local_190.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_190.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    i = 0;
    do {
      puVar5 = local_190.
               super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
               _M_impl.super__Vector_impl_data._M_start[i].m_v.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_190.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
          _M_impl.super__Vector_impl_data._M_start[i].m_v.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar5) {
        pvVar10 = local_190.
                  super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                  _M_impl.super__Vector_impl_data._M_start + i;
        lVar8 = 0;
        do {
          graph::add_edge(&local_100,i,puVar5[lVar8]);
          lVar8 = lVar8 + 1;
          puVar5 = (pvVar10->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (lVar8 != (long)(pvVar10->m_v).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3);
      }
      i = i + 1;
    } while (i < (ulong)(((long)local_190.
                                super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_190.
                                super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                        ));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_138,n,(allocator_type *)&local_168);
  if (puVar2 != local_178) {
    puVar5 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[puVar5[uVar9]] = uVar9;
      uVar9 = uVar9 + 1;
    } while (n + (n == 0) != uVar9);
  }
  if (puVar2 == local_178) {
    uVar11 = 0;
  }
  else {
    p_Var1 = &local_168._M_impl.super__Rb_tree_header;
    lVar8 = 0;
    uVar11 = 0;
    do {
      uVar9 = (order->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      uVar3 = local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9];
      my_set<merlin::edge_id>::my_set
                (&local_120,
                 local_100.m_adj.
                 super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar9);
      local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
      peVar12 = local_120.super_my_vector<merlin::edge_id>.
                super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_168._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_168._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      for (; peVar12 !=
             local_120.super_my_vector<merlin::edge_id>.
             super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
             super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
             super__Vector_impl_data._M_finish; peVar12 = peVar12 + 1) {
        local_170 = peVar12->second;
        if (uVar3 < local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_170]) {
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_168,&local_170);
        }
      }
      p_Var7 = local_168._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar4 = local_168._M_impl.super__Rb_tree_header._M_node_count;
      if (local_168._M_impl.super__Rb_tree_header._M_node_count < uVar11) {
        sVar4 = uVar11;
      }
      for (; uVar11 = sVar4, (_Rb_tree_header *)p_Var7 != p_Var1;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        for (p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
            (_Rb_tree_header *)p_Var6 != p_Var1;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          if (*(index *)(p_Var7 + 1) != *(index *)(p_Var6 + 1)) {
            graph::add_edge(&local_100,*(index *)(p_Var7 + 1),*(index *)(p_Var6 + 1));
          }
        }
        sVar4 = uVar11;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_168);
      if (local_120.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.super_my_vector<merlin::edge_id>.
                        super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != n + (n == 0));
  }
  if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  graph::~graph(&local_100);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_190);
  return uVar11;
}

Assistant:

size_t induced_width(const variable_order_t& order) const {
		//return pseudo_tree_size(order).first;

		size_t width = 0;
		std::vector<variable_set> adj = mrf();
		size_t n = order.size();
		graph g(n); // create the graph
		for (size_t i = 0; i < adj.size(); ++i) {
			const variable_set& vi = adj[i];
			for (variable_set::const_iterator cj = vi.begin();
					cj != vi.end(); ++cj) {
				size_t j = _vindex(*cj);
				g.add_edge(i, j);
			}
		}

		std::vector<size_t> position(n);
		for (size_t i = 0; i < n; ++i) {
			position[order[i]] = i;
		}

		// eliminate variables and create induced edges
		for (size_t i = 0; i < n; ++i) {
			size_t var = order[i];
			size_t pos = position[var];

			// find the neighbors appearing later in the ordering
			const my_set<edge_id> ns = g.neighbors(var);
			std::set<size_t> S;
			for (my_set<edge_id>::const_iterator si = ns.begin();
					si != ns.end(); ++si) {
				size_t j = si->second;
				if (position[j] > pos) {
					S.insert(j);
				}
			}

			// connect the neighbors appearing later in the ordering
			width = std::max(width, S.size());
			std::set<size_t>::iterator it1, it2;
			for (it1 = S.begin(); it1 != S.end(); ++it1) {
				it2 = it1;
				while (++it2 != S.end()) {
					size_t u = *it1, v = *it2;
					if (u != v) g.add_edge(u, v);
				}
			}
		}

		return width;
	}